

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdtar.c
# Opt level: O1

void usage(void)

{
  char *pcVar1;
  
  pcVar1 = lafe_getprogname();
  fwrite("Usage:\n",7,1,_stderr);
  fprintf(_stderr,"  List:    %s -tf <archive-filename>\n",pcVar1);
  fprintf(_stderr,"  Extract: %s -xf <archive-filename>\n",pcVar1);
  fprintf(_stderr,"  Create:  %s -cf <archive-filename> [filenames...]\n",pcVar1);
  fprintf(_stderr,"  Help:    %s --help\n",pcVar1);
  exit(1);
}

Assistant:

void
usage(void)
{
	const char	*p;

	p = lafe_getprogname();

	fprintf(stderr, "Usage:\n");
	fprintf(stderr, "  List:    %s -tf <archive-filename>\n", p);
	fprintf(stderr, "  Extract: %s -xf <archive-filename>\n", p);
	fprintf(stderr, "  Create:  %s -cf <archive-filename> [filenames...]\n", p);
	fprintf(stderr, "  Help:    %s --help\n", p);
	exit(1);
}